

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

TextureBlendType getBlendType(QSpanData *data)

{
  Type TVar1;
  
  TVar1 = (data->field_23).texture.type;
  if (TVar1 == Pattern) {
    return BlendTiled;
  }
  if (*(short *)&data->field_0x88 < 0x200) {
    return (TextureBlendType)(TVar1 == Tiled);
  }
  if (data->bilinear == true) {
    return TVar1 == Tiled | BlendTransformedBilinear;
  }
  return TVar1 == Tiled | BlendTransformed;
}

Assistant:

static TextureBlendType getBlendType(const QSpanData *data)
{
    TextureBlendType ft;
    if (data->texture.type == QTextureData::Pattern)
        ft = BlendTiled;
    else if (data->txop <= QTransform::TxTranslate)
        if (data->texture.type == QTextureData::Tiled)
            ft = BlendTiled;
        else
            ft = BlendUntransformed;
    else if (data->bilinear)
        if (data->texture.type == QTextureData::Tiled)
            ft = BlendTransformedBilinearTiled;
        else
            ft = BlendTransformedBilinear;
    else
        if (data->texture.type == QTextureData::Tiled)
            ft = BlendTransformedTiled;
        else
            ft = BlendTransformed;
    return ft;
}